

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O1

string * __thiscall ptTy::dbgTxt_abi_cxx11_(string *__return_storage_ptr__,ptTy *this)

{
  size_t sVar1;
  char buf [100];
  char acStack_78 [104];
  
  snprintf(acStack_78,100,"%7.5f, %7.5f",this->y,this->x);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_78);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_78,acStack_78 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ptTy::dbgTxt () const
{
    char buf[100];
    snprintf(buf, sizeof(buf), "%7.5f, %7.5f", y, x);
    return std::string(buf);
}